

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallHeapBlockAllocator.cpp
# Opt level: O3

void __thiscall
Memory::
SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::Clear(SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
        *this)

{
  size_t *psVar1;
  undefined4 *puVar2;
  SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
  *this_00;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  Recycler *pRVar7;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar8;
  FreeObject *pFVar9;
  undefined8 *in_FS_OFFSET;
  
  pSVar8 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)this->heapBlock;
  if (pSVar8 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    pFVar9 = this->freeObjectList;
    if (pFVar9 != (FreeObject *)0x0) {
      this_00 = (SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
                 *)*in_FS_OFFSET;
      do {
        pRVar7 = HeapBucket::GetRecycler(this->bucket);
        if ((pFVar9 < (FreeObject *)0x10000) || (((ulong)pFVar9 & 0xf) != 0)) {
LAB_0029be35:
          SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
          ::Clear(this_00);
          goto LAB_0029be3d;
        }
        pSVar8 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
                 HeapBlockMap64::GetHeapBlock(&pRVar7->heapBlockMap,pFVar9);
        if (pSVar8 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) goto LAB_0029be35;
        if ((pSVar8->super_HeapBlock).heapBlockType == LargeBlockType) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)this_00 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                             ,0x84,"(!heapBlockVerify->IsLargeHeapBlock())",
                             "!heapBlockVerify->IsLargeHeapBlock()");
          if (!bVar4) goto LAB_0029be3d;
          *(undefined4 *)this_00 = 0;
        }
        SmallHeapBlockT<MediumAllocationBlockAttributes>::ClearExplicitFreeBitForObject
                  (pSVar8,pFVar9);
        pFVar9 = FreeObject::GetNext(pFVar9);
      } while (pFVar9 != (FreeObject *)0x0);
      this->freeObjectList = (FreeObject *)0x0;
    }
    return;
  }
  if (pSVar8->isInAllocator == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x3c,"(heapBlock->isInAllocator)","heapBlock->isInAllocator");
    if (!bVar4) goto LAB_0029be3d;
    *puVar2 = 0;
  }
  pSVar8->isInAllocator = false;
  if (this->endAddress == (char *)0x0) {
    pFVar9 = this->freeObjectList;
    pSVar8->freeObjectList = pFVar9;
    this->freeObjectList = (FreeObject *)0x0;
    if (pFVar9 != (FreeObject *)0x0) {
      SmallHeapBlockT<MediumAllocationBlockAttributes>::SetIsClearedFromAllocator(pSVar8,true);
      goto LAB_0029be15;
    }
  }
  else {
    TrackNativeAllocatedObjects(this);
    this->lastNonNativeBumpAllocatedBlock = (char *)0x0;
    Recycler::TrackUnallocated
              (this->bucket->heapInfo->recycler,(char *)this->freeObjectList,this->endAddress,
               (ulong)this->bucket->sizeCat);
    RecyclerMemoryTracking::ReportUnallocated
              (((this->heapBlock->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>)
                .super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
                super_SmallHeapBlockT<MediumAllocationBlockAttributes>.heapBucket)->heapInfo->
               recycler,this->freeObjectList,this->endAddress,(ulong)pSVar8->heapBucket->sizeCat);
    if (pSVar8->freeObjectList != (FreeObject *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                         ,0x54,"(heapBlock->freeObjectList == nullptr)",
                         "heapBlock->freeObjectList == nullptr");
      if (!bVar4) goto LAB_0029be3d;
      *puVar2 = 0;
    }
    this->endAddress = (char *)0x0;
    this->freeObjectList = (FreeObject *)0x0;
  }
  uVar5 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetAndClearLastFreeCount(pSVar8);
  uVar6 = pSVar8->objectSize * uVar5;
  psVar1 = &(pSVar8->heapBucket->heapInfo->recycler->autoHeap).uncollectedAllocBytes;
  *psVar1 = *psVar1 + (ulong)uVar6;
  if (pSVar8->lastUncollectedAllocBytes != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x6f,"(heapBlock->lastUncollectedAllocBytes == 0)",
                       "heapBlock->lastUncollectedAllocBytes == 0");
    if (!bVar4) {
LAB_0029be3d:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
    uVar6 = uVar5 * pSVar8->objectSize;
  }
  pSVar8->lastUncollectedAllocBytes = uVar6;
LAB_0029be15:
  this->heapBlock = (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
  SmallHeapBlockT<MediumAllocationBlockAttributes>::CheckDebugFreeBitVector(pSVar8,false);
  return;
}

Assistant:

void
SmallHeapBlockAllocator<TBlockType>::Clear()
{
    TBlockType * heapBlock = this->heapBlock;
    if (heapBlock != nullptr)
    {
        Assert(heapBlock->isInAllocator);
        heapBlock->isInAllocator = false;
        FreeObject * remainingFreeObjectList = nullptr;
        if (this->endAddress != nullptr)
        {
#ifdef RECYCLER_TRACK_NATIVE_ALLOCATED_OBJECTS
            TrackNativeAllocatedObjects();
            lastNonNativeBumpAllocatedBlock = nullptr;
#endif
#ifdef PROFILE_RECYCLER_ALLOC
            // Need to tell the tracker
            this->bucket->heapInfo->recycler->TrackUnallocated((char *)this->freeObjectList, this->endAddress, this->bucket->sizeCat);
#endif
            RecyclerMemoryTracking::ReportUnallocated(this->heapBlock->heapBucket->heapInfo->recycler, (char *)this->freeObjectList, this->endAddress, heapBlock->heapBucket->sizeCat);
#ifdef RECYCLER_PERF_COUNTERS
            size_t unallocatedObjects = heapBlock->objectCount - ((char *)this->freeObjectList - heapBlock->address) / heapBlock->objectSize;
            size_t unallocatedObjectBytes = unallocatedObjects * heapBlock->GetObjectSize();
            RECYCLER_PERF_COUNTER_ADD(LiveObject, unallocatedObjects);
            RECYCLER_PERF_COUNTER_ADD(LiveObjectSize, unallocatedObjectBytes);
            RECYCLER_PERF_COUNTER_SUB(FreeObjectSize, unallocatedObjectBytes);
            RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockLiveObject, unallocatedObjects);
            RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockLiveObjectSize, unallocatedObjectBytes);
            RECYCLER_PERF_COUNTER_SUB(SmallHeapBlockFreeObjectSize, unallocatedObjectBytes);
#endif
            Assert(heapBlock->freeObjectList == nullptr);
            this->endAddress = nullptr;
        }
        else
        {
            remainingFreeObjectList = this->freeObjectList;
            heapBlock->freeObjectList = remainingFreeObjectList;
        }
        this->freeObjectList = nullptr;

        // this->freeObjectList and this->lastFreeCount are accessed in SmallHeapBlock::ResetMarks
        // the order of access there is first we see if lastFreeCount = 0, and if it is, we assert
        // that freeObjectList = null. Because of ARM's memory model, we need to insert barriers
        // so that the two variables can be accessed correctly across threads. Here, after we write
        // to this->freeObjectList, we insert a write barrier so that if this->lastFreeCount is 0,
        // this->freeObjectList must have been set to null. On the other end, we stick a read barrier
        // We use the MemoryBarrier macro because of ARMs lack of a separate read barrier
#if defined(_M_ARM32_OR_ARM64)
#if DBG
        MemoryBarrier();
#endif
#endif

        if (remainingFreeObjectList == nullptr)
        {
            uint lastFreeCount = heapBlock->GetAndClearLastFreeCount();
            heapBlock->heapBucket->heapInfo->recycler->autoHeap.uncollectedAllocBytes += lastFreeCount * heapBlock->GetObjectSize();
            Assert(heapBlock->lastUncollectedAllocBytes == 0);
            DebugOnly(heapBlock->lastUncollectedAllocBytes = lastFreeCount * heapBlock->GetObjectSize());
        }
        else
        {
            DebugOnly(heapBlock->SetIsClearedFromAllocator(true));
        }
        this->heapBlock = nullptr;

        RECYCLER_SLOW_CHECK(heapBlock->CheckDebugFreeBitVector(false));
    }
    else if (this->freeObjectList != nullptr)
    {
        // Explicit Free Object List
#ifdef RECYCLER_MEMORY_VERIFY
        FreeObject* freeObject = this->freeObjectList;

        while (freeObject)
        {
            HeapBlock* heapBlockVerify = this->bucket->GetRecycler()->FindHeapBlock((void*) freeObject);
            Assert(heapBlockVerify != nullptr);
            Assert(!heapBlockVerify->IsLargeHeapBlock());
            TBlockType* smallBlock = (TBlockType*)heapBlockVerify;

            smallBlock->ClearExplicitFreeBitForObject((void*) freeObject);
            freeObject = freeObject->GetNext();
        }
#endif
        this->freeObjectList = nullptr;
    }
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP 
    DebugOnly(this->isAllocatingFromNewBlock = false);
#endif
}